

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

int __thiscall
btGeneric6DofSpring2Constraint::get_limit_motor_info2
          (btGeneric6DofSpring2Constraint *this,btRotationalLimitMotor2 *limot,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB,btConstraintInfo2 *info,int row,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int in_ECX;
  btScalar *in_RSI;
  btTypedConstraint *in_RDI;
  btVector3 *in_R8;
  btVector3 *in_R9;
  btScalar bVar4;
  btScalar bVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  btVector3 *in_stack_00000008;
  btVector3 *in_stack_00000010;
  float *in_stack_00000018;
  int in_stack_00000020;
  btVector3 *in_stack_00000028;
  int in_stack_00000030;
  btScalar maxf;
  btScalar minf;
  btScalar f;
  btScalar fd;
  btScalar fs;
  btScalar angularfreq;
  btScalar m;
  btScalar mB;
  btScalar mA;
  btScalar cfm;
  btScalar vel_1;
  btScalar ks;
  btScalar kd;
  btScalar dt;
  btScalar error_1;
  btScalar hiLimit;
  btScalar lowLimit;
  btScalar mot_fact_1;
  btScalar tag_vel_1;
  btScalar targetvelocity;
  btScalar error;
  btScalar mot_fact;
  btScalar tag_vel;
  btScalar bounceerror_3;
  btScalar bounceerror_2;
  btScalar bounceerror_1;
  btScalar bounceerror;
  btScalar vel;
  int srow;
  int count;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_104;
  float local_f8;
  btScalar local_f4;
  btScalar local_f0;
  btScalar local_ec;
  btScalar local_e8;
  btScalar local_e4;
  btScalar local_e0;
  undefined4 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  float local_b4;
  float local_7c;
  float local_78;
  btScalar local_6c;
  btScalar local_68;
  btScalar in_stack_ffffffffffffff9c;
  btScalar in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffa8;
  btScalar in_stack_ffffffffffffffac;
  btScalar in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  
  local_34 = 0;
  local_38 = in_stack_00000020 * (int)in_stack_00000018[10];
  if (in_RSI[0x15] == 5.60519e-45) {
    if (in_stack_00000030 == 0) {
      bVar4 = btVector3::dot(in_R8,in_stack_00000028);
      bVar5 = btVector3::dot(in_R9,in_stack_00000028);
      local_b4 = bVar4 - bVar5;
    }
    else {
      bVar4 = btVector3::dot(in_stack_00000008,in_stack_00000028);
      bVar5 = btVector3::dot(in_stack_00000010,in_stack_00000028);
      local_b4 = bVar4 - bVar5;
    }
    calculateJacobi((btGeneric6DofSpring2Constraint *)CONCAT44(local_b4,in_stack_ffffffffffffffc0),
                    (btRotationalLimitMotor2 *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (btTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    (btTransform *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (btConstraintInfo2 *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (int)in_stack_ffffffffffffff9c,in_R9,(int)in_R8,in_ECX);
    iVar3 = 1;
    if (in_stack_00000030 != 0) {
      iVar3 = -1;
    }
    *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) =
         *in_stack_00000018 * in_RSI[3] * in_RSI[0x12] * (float)iVar3;
    if (in_stack_00000030 == 0) {
      if ((-local_b4 * in_RSI[3] +
           *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) < 0.0) &&
         (in_stack_ffffffffffffffbc = -in_RSI[2] * local_b4,
         in_stack_ffffffffffffffbc <
         *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4))) {
        *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) =
             in_stack_ffffffffffffffbc;
      }
    }
    else if ((0.0 < -local_b4 * in_RSI[3] +
                    *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4)) &&
            (in_stack_ffffffffffffffc0 = -in_RSI[2] * local_b4,
            pfVar1 = (float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4),
            *pfVar1 <= in_stack_ffffffffffffffc0 && in_stack_ffffffffffffffc0 != *pfVar1)) {
      *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) =
           in_stack_ffffffffffffffc0;
    }
    local_c0 = 0;
    if (in_stack_00000030 == 0) {
      local_c0 = 0xff7fffff;
    }
    *(undefined4 *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_38 * 4) = local_c0;
    local_c8 = 0x7f7fffff;
    if (in_stack_00000030 == 0) {
      local_c8 = 0;
    }
    *(undefined4 *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_38 * 4) = local_c8;
    *(btScalar *)(*(long *)(in_stack_00000018 + 0xe) + (long)local_38 * 4) = in_RSI[4];
    local_38 = (int)in_stack_00000018[10] + local_38;
    calculateJacobi((btGeneric6DofSpring2Constraint *)CONCAT44(local_b4,in_stack_ffffffffffffffc0),
                    (btRotationalLimitMotor2 *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (btTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    (btTransform *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (btConstraintInfo2 *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (int)in_stack_ffffffffffffff9c,in_R9,(int)in_R8,in_ECX);
    iVar3 = 1;
    if (in_stack_00000030 != 0) {
      iVar3 = -1;
    }
    *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) =
         *in_stack_00000018 * in_RSI[3] * in_RSI[0x13] * (float)iVar3;
    if (in_stack_00000030 == 0) {
      if ((0.0 < -local_b4 * in_RSI[3] +
                 *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4)) &&
         (in_stack_ffffffffffffffb4 = -in_RSI[2] * local_b4,
         pfVar1 = (float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4),
         *pfVar1 <= in_stack_ffffffffffffffb4 && in_stack_ffffffffffffffb4 != *pfVar1)) {
        *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) =
             in_stack_ffffffffffffffb4;
      }
    }
    else if ((-local_b4 * in_RSI[3] +
              *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) < 0.0) &&
            (in_stack_ffffffffffffffb8 = -in_RSI[2] * local_b4,
            in_stack_ffffffffffffffb8 <
            *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4))) {
      *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) =
           in_stack_ffffffffffffffb8;
    }
    local_d0 = 0xff7fffff;
    if (in_stack_00000030 == 0) {
      local_d0 = 0;
    }
    *(undefined4 *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_38 * 4) = local_d0;
    local_d8 = 0;
    if (in_stack_00000030 == 0) {
      local_d8 = 0x7f7fffff;
    }
    *(undefined4 *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_38 * 4) = local_d8;
    *(btScalar *)(*(long *)(in_stack_00000018 + 0xe) + (long)local_38 * 4) = in_RSI[4];
    local_38 = (int)in_stack_00000018[10] + local_38;
    local_34 = 2;
  }
  else {
    local_b4 = in_stack_ffffffffffffffc4;
    if (in_RSI[0x15] == 4.2039e-45) {
      calculateJacobi((btGeneric6DofSpring2Constraint *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (btRotationalLimitMotor2 *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (btTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (btTransform *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (btConstraintInfo2 *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (int)in_stack_ffffffffffffff9c,in_R9,(int)in_R8,in_ECX);
      iVar3 = 1;
      if (in_stack_00000030 != 0) {
        iVar3 = -1;
      }
      *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) =
           *in_stack_00000018 * in_RSI[3] * in_RSI[0x12] * (float)iVar3;
      *(undefined4 *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_38 * 4) = 0xff7fffff;
      *(undefined4 *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_38 * 4) = 0x7f7fffff;
      *(btScalar *)(*(long *)(in_stack_00000018 + 0xe) + (long)local_38 * 4) = in_RSI[4];
      local_38 = (int)in_stack_00000018[10] + local_38;
      local_34 = 1;
      local_b4 = in_stack_ffffffffffffffc4;
    }
  }
  local_e4 = in_stack_ffffffffffffffa4;
  if ((((uint)in_RSI[7] & 1) != 0) && (((uint)in_RSI[10] & 1) == 0)) {
    calculateJacobi((btGeneric6DofSpring2Constraint *)CONCAT44(local_b4,in_stack_ffffffffffffffc0),
                    (btRotationalLimitMotor2 *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (btTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    (btTransform *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (btConstraintInfo2 *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (int)in_stack_ffffffffffffff9c,in_R9,(int)in_R8,in_ECX);
    if (in_stack_00000030 == 0) {
      local_e0 = -in_RSI[8];
    }
    else {
      local_e0 = in_RSI[8];
    }
    in_stack_ffffffffffffffac =
         btTypedConstraint::getMotorFactor
                   (in_RDI,in_RSI[0x14],*in_RSI,in_RSI[1],local_e0,*in_stack_00000018 * in_RSI[5]);
    *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) =
         in_stack_ffffffffffffffac * in_RSI[8];
    *(float *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_38 * 4) = -in_RSI[9];
    *(btScalar *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_38 * 4) = in_RSI[9];
    *(btScalar *)(*(long *)(in_stack_00000018 + 0xe) + (long)local_38 * 4) = in_RSI[6];
    local_38 = (int)in_stack_00000018[10] + local_38;
    local_34 = local_34 + 1;
    local_e4 = in_stack_ffffffffffffffa4;
    in_stack_ffffffffffffffb0 = local_e0;
  }
  if ((((uint)in_RSI[7] & 1) != 0) && (((uint)in_RSI[10] & 1) != 0)) {
    in_stack_ffffffffffffffa8 = in_RSI[0x14] - in_RSI[0xb];
    calculateJacobi((btGeneric6DofSpring2Constraint *)CONCAT44(local_b4,in_stack_ffffffffffffffc0),
                    (btRotationalLimitMotor2 *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (btTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    (btTransform *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (btConstraintInfo2 *)CONCAT44(local_e4,in_stack_ffffffffffffffa0),
                    (int)in_stack_ffffffffffffff9c,in_R9,(int)in_R8,in_ECX);
    if (0.0 <= in_stack_ffffffffffffffa8) {
      local_e4 = in_RSI[8];
    }
    else {
      local_e4 = -in_RSI[8];
    }
    in_stack_ffffffffffffffa0 = -local_e4;
    if ((in_stack_ffffffffffffffa8 != 0.0) || (NAN(in_stack_ffffffffffffffa8))) {
      if (*in_RSI < in_RSI[1] || *in_RSI == in_RSI[1]) {
        if ((in_stack_ffffffffffffffa8 <= 0.0) || (in_RSI[0xb] < *in_RSI || in_RSI[0xb] == *in_RSI))
        {
          local_f0 = *in_RSI;
        }
        else {
          local_f0 = in_RSI[0xb];
        }
        local_68 = local_f0;
        if ((0.0 <= in_stack_ffffffffffffffa8) || (in_RSI[1] <= in_RSI[0xb])) {
          local_f4 = in_RSI[1];
        }
        else {
          local_f4 = in_RSI[0xb];
        }
        local_6c = local_f4;
      }
      else {
        if (in_stack_ffffffffffffffa8 <= 0.0) {
          local_e8 = -3.4028235e+38;
        }
        else {
          local_e8 = in_RSI[0xb];
        }
        local_68 = local_e8;
        if (0.0 <= in_stack_ffffffffffffffa8) {
          local_ec = 3.4028235e+38;
        }
        else {
          local_ec = in_RSI[0xb];
        }
        local_6c = local_ec;
      }
      in_stack_ffffffffffffff9c =
           btTypedConstraint::getMotorFactor
                     (in_RDI,in_RSI[0x14],local_68,local_6c,in_stack_ffffffffffffffa0,
                      *in_stack_00000018 * in_RSI[5]);
    }
    else {
      in_stack_ffffffffffffff9c = 0.0;
    }
    iVar3 = 1;
    if (in_stack_00000030 != 0) {
      iVar3 = -1;
    }
    *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) =
         in_stack_ffffffffffffff9c * local_e4 * (float)iVar3;
    *(float *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_38 * 4) = -in_RSI[9];
    *(btScalar *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_38 * 4) = in_RSI[9];
    *(btScalar *)(*(long *)(in_stack_00000018 + 0xe) + (long)local_38 * 4) = in_RSI[6];
    local_38 = (int)in_stack_00000018[10] + local_38;
    local_34 = local_34 + 1;
  }
  if (((uint)in_RSI[0xc] & 1) != 0) {
    fVar7 = in_RSI[0x14];
    fVar2 = in_RSI[0x11];
    calculateJacobi((btGeneric6DofSpring2Constraint *)CONCAT44(local_b4,in_stack_ffffffffffffffc0),
                    (btRotationalLimitMotor2 *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (btTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    (btTransform *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (btConstraintInfo2 *)CONCAT44(local_e4,in_stack_ffffffffffffffa0),
                    (int)in_stack_ffffffffffffff9c,in_R9,(int)in_R8,in_ECX);
    fVar6 = 1.0 / *in_stack_00000018;
    local_78 = in_RSI[0xf];
    local_7c = in_RSI[0xd];
    if (in_stack_00000030 == 0) {
      bVar4 = btVector3::dot(in_R8,in_stack_00000028);
      bVar5 = btVector3::dot(in_R9,in_stack_00000028);
      local_f8 = bVar4 - bVar5;
    }
    else {
      bVar4 = btVector3::dot(in_stack_00000008,in_stack_00000028);
      bVar5 = btVector3::dot(in_stack_00000010,in_stack_00000028);
      local_f8 = bVar4 - bVar5;
    }
    bVar4 = btRigidBody::getInvMass(in_RDI->m_rbA);
    local_104 = 1.0 / bVar4;
    bVar4 = btRigidBody::getInvMass(in_RDI->m_rbB);
    if (1.0 / bVar4 < local_104) {
      local_104 = 1.0 / bVar4;
    }
    dVar8 = std::sqrt((double)(ulong)(uint)(local_7c / local_104));
    if ((((uint)in_RSI[0xe] & 1) != 0) && (0.25 < SUB84(dVar8,0) * fVar6)) {
      local_7c = (((1.0 / fVar6) / fVar6) / 16.0) * local_104;
    }
    if ((((uint)in_RSI[0x10] & 1) != 0) && (local_104 < local_78 * fVar6)) {
      local_78 = local_104 / fVar6;
    }
    iVar3 = 1;
    if (in_stack_00000030 != 0) {
      iVar3 = -1;
    }
    local_110 = -local_78 * local_f8 * (float)iVar3 * fVar6;
    fVar7 = local_7c * (fVar7 - fVar2) * fVar6 + local_110;
    iVar3 = 1;
    if (in_stack_00000030 != 0) {
      iVar3 = -1;
    }
    *(float *)(*(long *)(in_stack_00000018 + 0xc) + (long)local_38 * 4) =
         fVar7 * (float)iVar3 + local_f8;
    local_10c = fVar7;
    if (fVar7 < local_110) {
      local_10c = local_110;
      local_110 = fVar7;
    }
    if (in_stack_00000030 == 0) {
      if (0.0 < local_110) {
        local_110 = 0.0;
      }
      *(float *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_38 * 4) = local_110;
      if (0.0 <= local_10c) {
        local_114 = local_10c;
      }
      else {
        local_114 = 0.0;
      }
      *(float *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_38 * 4) = local_114;
    }
    else {
      if (-local_10c <= 0.0) {
        local_118 = -local_10c;
      }
      else {
        local_118 = 0.0;
      }
      *(float *)(*(long *)(in_stack_00000018 + 0x10) + (long)local_38 * 4) = local_118;
      if (0.0 <= -local_110) {
        local_11c = -local_110;
      }
      else {
        local_11c = 0.0;
      }
      *(float *)(*(long *)(in_stack_00000018 + 0x12) + (long)local_38 * 4) = local_11c;
    }
    *(undefined4 *)(*(long *)(in_stack_00000018 + 0xe) + (long)local_38 * 4) = 0;
    local_34 = local_34 + 1;
  }
  return local_34;
}

Assistant:

int btGeneric6DofSpring2Constraint::get_limit_motor_info2(
	btRotationalLimitMotor2 * limot,
	const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB,
	btConstraintInfo2 *info, int row, btVector3& ax1, int rotational,int rotAllowed)
{
	int count = 0;
	int srow = row * info->rowskip;

	if (limot->m_currentLimit==4) 
	{
		btScalar vel = rotational ? angVelA.dot(ax1) - angVelB.dot(ax1) : linVelA.dot(ax1) - linVelB.dot(ax1);

		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitError * (rotational ? -1 : 1);
		if (rotational) {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP > 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror > info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		} else {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP < 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror < info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		}
		info->m_lowerLimit[srow] = rotational ? 0 : -SIMD_INFINITY;
		info->m_upperLimit[srow] = rotational ? SIMD_INFINITY : 0;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;

		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitErrorHi * (rotational ? -1 : 1);
		if (rotational) {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP < 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror < info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		} else {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP > 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror > info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		}
		info->m_lowerLimit[srow] = rotational ? -SIMD_INFINITY : 0;
		info->m_upperLimit[srow] = rotational ? 0 : SIMD_INFINITY;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;
	} else
	if (limot->m_currentLimit==3) 
	{
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitError * (rotational ? -1 : 1);
		info->m_lowerLimit[srow] = -SIMD_INFINITY;
		info->m_upperLimit[srow] = SIMD_INFINITY;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableMotor && !limot->m_servoMotor)
	{
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		btScalar tag_vel = rotational ? limot->m_targetVelocity : -limot->m_targetVelocity;
		btScalar mot_fact = getMotorFactor(limot->m_currentPosition, 
			limot->m_loLimit,
			limot->m_hiLimit,
			tag_vel,
			info->fps * limot->m_motorERP);
		info->m_constraintError[srow] = mot_fact * limot->m_targetVelocity;
		info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
		info->m_upperLimit[srow] = limot->m_maxMotorForce;
		info->cfm[srow] = limot->m_motorCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableMotor && limot->m_servoMotor)
	{
		btScalar error = limot->m_currentPosition - limot->m_servoTarget;
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		btScalar targetvelocity = error<0 ? -limot->m_targetVelocity : limot->m_targetVelocity;
		btScalar tag_vel = -targetvelocity;
		btScalar mot_fact;
		if(error != 0)
		{
			btScalar lowLimit;
			btScalar hiLimit;
			if(limot->m_loLimit > limot->m_hiLimit)
			{
				lowLimit = error > 0 ? limot->m_servoTarget : -SIMD_INFINITY;
				hiLimit  = error < 0 ? limot->m_servoTarget :  SIMD_INFINITY;
			}
			else
			{
				lowLimit = error > 0 && limot->m_servoTarget>limot->m_loLimit ? limot->m_servoTarget : limot->m_loLimit;
				hiLimit  = error < 0 && limot->m_servoTarget<limot->m_hiLimit ? limot->m_servoTarget : limot->m_hiLimit;
			}
			mot_fact = getMotorFactor(limot->m_currentPosition, lowLimit, hiLimit, tag_vel, info->fps * limot->m_motorERP);
		} 
		else 
		{
			mot_fact = 0;
		}
		info->m_constraintError[srow] = mot_fact * targetvelocity * (rotational ? -1 : 1);
		info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
		info->m_upperLimit[srow] = limot->m_maxMotorForce;
		info->cfm[srow] = limot->m_motorCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableSpring)
	{
		btScalar error = limot->m_currentPosition - limot->m_equilibriumPoint;
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);

		//btScalar cfm = 1.0 / ((1.0/info->fps)*limot->m_springStiffness+ limot->m_springDamping);
		//if(cfm > 0.99999)
		//	cfm = 0.99999;
		//btScalar erp = (1.0/info->fps)*limot->m_springStiffness / ((1.0/info->fps)*limot->m_springStiffness + limot->m_springDamping);
		//info->m_constraintError[srow] = info->fps * erp * error * (rotational ? -1.0 : 1.0);
		//info->m_lowerLimit[srow] = -SIMD_INFINITY;
		//info->m_upperLimit[srow] = SIMD_INFINITY;

		btScalar dt = BT_ONE / info->fps;
		btScalar kd = limot->m_springDamping;
		btScalar ks = limot->m_springStiffness;
		btScalar vel = rotational ? angVelA.dot(ax1) - angVelB.dot(ax1) : linVelA.dot(ax1) - linVelB.dot(ax1);
//		btScalar erp = 0.1;
		btScalar cfm = BT_ZERO;
		btScalar mA = BT_ONE / m_rbA.getInvMass();
		btScalar mB = BT_ONE / m_rbB.getInvMass();
		btScalar m = mA > mB ? mB : mA;
		btScalar angularfreq = sqrt(ks / m);


		//limit stiffness (the spring should not be sampled faster that the quarter of its angular frequency)
		if(limot->m_springStiffnessLimited && 0.25 < angularfreq * dt)
		{
			ks = BT_ONE / dt / dt / btScalar(16.0) * m;
		}
		//avoid damping that would blow up the spring
		if(limot->m_springDampingLimited && kd * dt > m)
		{
			kd = m / dt;
		}
		btScalar fs = ks * error * dt;
		btScalar fd = -kd * (vel) * (rotational ? -1 : 1) * dt;
		btScalar f = (fs+fd);

		info->m_constraintError[srow] = (vel + f * (rotational ? -1 : 1)) ;

		btScalar minf = f < fd ? f : fd;
		btScalar maxf = f < fd ? fd : f;
		if(!rotational)
		{
			info->m_lowerLimit[srow] = minf > 0 ? 0 : minf;
			info->m_upperLimit[srow] = maxf < 0 ? 0 : maxf;
		}
		else
		{
			info->m_lowerLimit[srow] = -maxf > 0 ? 0 : -maxf;
			info->m_upperLimit[srow] = -minf < 0 ? 0 : -minf;
		}

		info->cfm[srow] = cfm;
		srow += info->rowskip;
		++count;
	}

	return count;
}